

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O1

void * array_rangeop_new(_class *class,t_symbol *s,int *argcp,t_atom **argvp,int onsetin,int nin,
                        int warnextra)

{
  _gobj **gp;
  _gobj **fp;
  t_float *fp_00;
  t_atom *ptVar1;
  int iVar2;
  t_object *owner;
  t_symbol *ptVar3;
  _inlet *p_Var4;
  char *pcVar5;
  int argc;
  t_atom *argv;
  
  argc = *(int *)&s->s_name;
  argv = *(t_atom **)argcp;
  owner = (t_object *)pd_new(class);
  owner[1].te_g.g_pd = (t_pd)0x0;
  gp = &owner[1].te_g.g_next;
  owner[1].te_inlet = (_inlet *)0x0;
  owner[1].te_xpix = 0;
  owner[1].te_ypix = 0;
  owner[1].te_width = 0;
  *(undefined2 *)&owner[1].field_0x2e = 0;
  gpointer_init((t_gpointer *)gp);
  owner[2].te_outlet = (_outlet *)&s_;
  ptVar3 = gensym("y");
  owner[2].te_binbuf = (_binbuf *)ptVar3;
  fp = &owner[2].te_g.g_next;
  owner[2].te_g.g_next = (_gobj *)0xbf80000000000000;
  if ((int)argvp != 0) {
    floatinlet_new(owner,(t_float *)fp);
  }
  fp_00 = (t_float *)((long)&owner[2].te_g.g_next + 4);
  if (onsetin != 0) {
    floatinlet_new(owner,fp_00);
  }
  do {
    if (argc == 0) {
      argc = 0;
LAB_0017ceac:
      if (argc == 0) {
        argc = 0;
      }
      else if (argv->a_type == A_FLOAT) {
        *(t_float *)fp = (argv->a_w).w_float;
        argc = argc + -1;
        argv = argv + 1;
      }
      if (argc == 0) {
        argc = 0;
      }
      else if (argv->a_type == A_FLOAT) {
        *fp_00 = (argv->a_w).w_float;
        argc = argc + -1;
        argv = argv + 1;
      }
      if (argc != 0) {
        pcVar5 = class_getname(class);
        post("warning: %s ignoring extra argument: ",pcVar5);
        postatom(argc,argv);
        endpost();
      }
      if (owner[1].te_inlet == (_inlet *)0x0) {
        symbolinlet_new(owner,&((word *)(owner + 1))->w_symbol);
      }
      else {
        pointerinlet_new(owner,(t_gpointer *)gp);
      }
      *(int *)&s->s_name = argc;
      *(t_atom **)argcp = argv;
      return owner;
    }
    if (argv->a_type != A_SYMBOL) goto LAB_0017ceac;
    pcVar5 = ((argv->a_w).w_symbol)->s_name;
    if (*pcVar5 != '-') {
      if (owner[1].te_inlet == (_inlet *)0x0) {
        *(word *)(owner + 1) = argv->a_w;
      }
      else {
        pcVar5 = class_getname(class);
        pd_error(owner,"%s: extra names after -s..",pcVar5);
        postatom(argc,argv);
        endpost();
      }
      argc = argc + -1;
      argv = argv + 1;
      goto LAB_0017ceac;
    }
    iVar2 = strcmp(pcVar5,"-s");
    if ((((argc < 3) || (iVar2 != 0)) || (argv[1].a_type != A_SYMBOL)) ||
       (argv[2].a_type != A_SYMBOL)) {
      iVar2 = strcmp(pcVar5,"-f");
      if (((argc < 3) || (iVar2 != 0)) ||
         ((argv[1].a_type != A_SYMBOL || (argv[2].a_type != A_SYMBOL)))) {
        pcVar5 = class_getname(class);
        pd_error(owner,"%s: unknown flag ...",pcVar5);
        postatom(argc,argv);
        endpost();
      }
      else {
        owner[2].te_outlet = (_outlet *)argv[1].a_w;
        ptVar1 = argv + 2;
        argv = argv + 2;
        owner[2].te_binbuf = (_binbuf *)ptVar1->a_w;
        argc = argc + -2;
      }
    }
    else {
      p_Var4 = (_inlet *)canvas_makebindsym(argv[1].a_w.w_symbol);
      owner[1].te_inlet = p_Var4;
      *(word *)&owner[1].te_xpix = argv[2].a_w;
      argc = argc + -2;
      argv = argv + 2;
    }
    argv = argv + 1;
    argc = argc + -1;
  } while( true );
}

Assistant:

static void *array_rangeop_new(t_class *class,
    t_symbol *s, int *argcp, t_atom **argvp,
    int onsetin, int nin, int warnextra)
{
    int argc = *argcp;
    t_atom *argv = *argvp;
    t_array_rangeop *x = (t_array_rangeop *)pd_new(class);
    x->x_sym = x->x_struct = x->x_field = 0;
    gpointer_init(&x->x_gp);
    x->x_elemtemplate = &s_;
    x->x_elemfield = gensym("y");
    x->x_onset = 0;
    x->x_n = -1;
    if (onsetin)
        floatinlet_new(&x->x_tc.tc_obj, &x->x_onset);
    if (nin)
        floatinlet_new(&x->x_tc.tc_obj, &x->x_n);
    while (argc && argv->a_type == A_SYMBOL &&
        *argv->a_w.w_symbol->s_name == '-')
    {
        if (!strcmp(argv->a_w.w_symbol->s_name, "-s") &&
            argc >= 3 && argv[1].a_type == A_SYMBOL &&
                argv[2].a_type == A_SYMBOL)
        {
            x->x_struct = canvas_makebindsym(argv[1].a_w.w_symbol);
            x->x_field = argv[2].a_w.w_symbol;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(argv->a_w.w_symbol->s_name, "-f") &&
            argc >= 3 && argv[1].a_type == A_SYMBOL &&
                argv[2].a_type == A_SYMBOL)
        {
            x->x_elemtemplate = argv[1].a_w.w_symbol;
            x->x_elemfield = argv[2].a_w.w_symbol;
            argc -= 2; argv += 2;
        }
        else
        {
            pd_error(x, "%s: unknown flag ...", class_getname(class));
            postatom(argc, argv); endpost();
        }
        argc--; argv++;
    }
    if (argc && argv->a_type == A_SYMBOL)
    {
        if (x->x_struct)
        {
            pd_error(x, "%s: extra names after -s..", class_getname(class));
            postatom(argc, argv); endpost();
        }
        else x->x_sym = argv->a_w.w_symbol;
        argc--; argv++;
    }
    if (argc && argv->a_type == A_FLOAT)
    {
        x->x_onset = argv->a_w.w_float;
        argc--; argv++;
    }
    if (argc && argv->a_type == A_FLOAT)
    {
        x->x_n = argv->a_w.w_float;
        argc--; argv++;
    }
    if (argc && warnextra)
    {
        post("warning: %s ignoring extra argument: ", class_getname(class));
        postatom(argc, argv); endpost();
    }
    if (x->x_struct)
        pointerinlet_new(&x->x_tc.tc_obj, &x->x_gp);
    else symbolinlet_new(&x->x_tc.tc_obj, &x->x_tc.tc_sym);
    *argcp = argc;
    *argvp = argv;
    return (x);
}